

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcrepl.cpp
# Opt level: O2

int32_t __thiscall
icu_63::FunctionReplacer::replace
          (FunctionReplacer *this,Replaceable *text,int32_t start,int32_t limit,int32_t *cursor)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*(this->replacer->super_UObject)._vptr_UObject[5])();
  iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x10))
                    ((long *)CONCAT44(extraout_var,iVar1),text,start,limit,cursor);
  iVar1 = (*(this->translit->super_UObject)._vptr_UObject[4])
                    (this->translit,text,(ulong)(uint)start,(ulong)(uint)(iVar1 + start));
  return iVar1 - start;
}

Assistant:

int32_t FunctionReplacer::replace(Replaceable& text,
                                  int32_t start,
                                  int32_t limit,
                                  int32_t& cursor)
{

    // First delegate to subordinate replacer
    int32_t len = replacer->toReplacer()->replace(text, start, limit, cursor);
    limit = start + len;

    // Now transliterate
    limit = translit->transliterate(text, start, limit);

    return limit - start;
}